

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

uint64_t anon_unknown.dwarf_2dd8b::fmp4_endian_swap64(uint64_t in)

{
  uint64_t in_local;
  
  return in << 0x38 | (in & 0xff00) << 0x28 | (in & 0xff0000) << 0x18 | (in & 0xff000000) << 8 |
         (in & 0xff00000000) >> 8 | (in & 0xff0000000000) >> 0x18 | (in & 0xff000000000000) >> 0x28
         | in >> 0x38;
}

Assistant:

uint64_t fmp4_endian_swap64(uint64_t in) {
		return  ((in & 0x00000000000000FF) << 56) | \
			((in & 0x000000000000FF00) << 40) | \
			((in & 0x0000000000FF0000) << 24) | \
			((in & 0x00000000FF000000) << 8) | \
			((in & 0x000000FF00000000) >> 8) | \
			((in & 0x0000FF0000000000) >> 24) | \
			((in & 0x00FF000000000000) >> 40) | \
			((in & 0xFF00000000000000) >> 56);
	}